

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvtree_mpi.c
# Opt level: O1

int kvtree_sendrecv(kvtree *hash_send,int rank_send,kvtree *hash_recv,int rank_recv,MPI_Comm comm)

{
  size_t sVar1;
  char cVar2;
  uint uVar3;
  int size_recv;
  int size_send;
  char *buf_recv;
  char *buf_send;
  MPI_Request request [2];
  MPI_Status status [2];
  int local_a0;
  int local_9c;
  char *local_98;
  char *local_90;
  undefined1 local_88 [24];
  kvtree *local_70;
  undefined1 local_68 [56];
  
  if (rank_recv != -2) {
    kvtree_unset_all(hash_recv);
    local_9c = 0;
    local_a0 = 0;
    MPI_Irecv(&local_a0,1,&ompi_mpi_int,rank_recv,0,comm,local_88);
  }
  else {
    local_9c = 0;
    local_a0 = 0;
  }
  uVar3 = (uint)(rank_recv != -2);
  if (rank_send != -2) {
    local_70 = hash_recv;
    sVar1 = kvtree_pack_size(hash_send);
    if ((sVar1 & 0xffffffff80000000) != 0) {
      kvtree_abort(-1,"kvtree_sendrecv: hash size %lu is bigger than INT_MAX %d @ %s:%d",sVar1,
                   0x7fffffff,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/src/kvtree_mpi.c"
                   ,0x7a);
    }
    local_9c = (int)sVar1;
    MPI_Isend(&local_9c,1,&ompi_mpi_int,rank_send,0,comm,local_88 + (ulong)uVar3 * 8);
    uVar3 = uVar3 + 1;
    hash_recv = local_70;
  }
  if (uVar3 != 0) {
    MPI_Waitall(uVar3,local_88,local_68);
  }
  local_90 = (char *)0x0;
  local_98 = (char *)0x0;
  cVar2 = 0 < (long)local_a0;
  if ((bool)cVar2) {
    local_98 = (char *)kvtree_malloc((long)local_a0,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/src/kvtree_mpi.c"
                                     ,0x8d);
    MPI_Irecv(local_98,local_a0,&ompi_mpi_byte,rank_recv,0,comm,local_88);
  }
  if (0 < (long)local_9c) {
    local_90 = (char *)kvtree_malloc((long)local_9c,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/src/kvtree_mpi.c"
                                     ,0x93);
    kvtree_pack(local_90,hash_send);
    MPI_Isend(local_90,local_9c,&ompi_mpi_byte,rank_send,0,comm,local_88 + (ulong)(byte)cVar2 * 8);
    cVar2 = cVar2 + '\x01';
  }
  if (cVar2 != '\0') {
    MPI_Waitall(cVar2,local_88,local_68);
  }
  if (0 < local_a0) {
    kvtree_unpack(local_98,hash_recv);
  }
  kvtree_free(&local_98);
  kvtree_free(&local_90);
  return 0;
}

Assistant:

int kvtree_sendrecv(const kvtree* hash_send, int rank_send,
                            kvtree* hash_recv, int rank_recv,
                            MPI_Comm comm)
{
  int rc = KVTREE_SUCCESS;

  int num_req;
  MPI_Request request[2];
  MPI_Status  status[2];

  /* determine whether we have a rank to send to and a rank to receive from */
  int have_outgoing = 0;
  int have_incoming = 0;
  if (rank_send != MPI_PROC_NULL) {
    have_outgoing = 1;
  }
  if (rank_recv != MPI_PROC_NULL) {
    kvtree_unset_all(hash_recv);
    have_incoming = 1;
  }

  /* exchange hash pack sizes in order to allocate buffers */
  num_req = 0;
  int size_send = 0;
  int size_recv = 0;
  if (have_incoming) {
    MPI_Irecv(&size_recv, 1, MPI_INT, rank_recv, 0, comm, &request[num_req]);
    num_req++;
  }
  if (have_outgoing) {
    /* get size of packed hash and check that it doesn't exceed INT_MAX */
    size_t pack_size = kvtree_pack_size(hash_send);
    size_t max_int = (size_t) INT_MAX;
    if (pack_size > max_int) {
      kvtree_abort(-1, "kvtree_sendrecv: hash size %lu is bigger than INT_MAX %d @ %s:%d",
        (unsigned long) pack_size, INT_MAX, __FILE__, __LINE__
      );
    }

    /* tell rank how big the pack size is */
    size_send = (int) pack_size;
    MPI_Isend(&size_send, 1, MPI_INT, rank_send, 0, comm, &request[num_req]);
    num_req++;
  }
  if (num_req > 0) {
    MPI_Waitall(num_req, request, status);
  }

  /* allocate space to pack our hash and space to receive the incoming hash */
  num_req = 0;
  char* buf_send = NULL;
  char* buf_recv = NULL;
  if (size_recv > 0) {
    /* allocate space to receive a packed hash, and receive it */
    buf_recv = (char*) KVTREE_MALLOC((size_t)size_recv);
    MPI_Irecv(buf_recv, size_recv, MPI_BYTE, rank_recv, 0, comm, &request[num_req]);
    num_req++;
  }
  if (size_send > 0) {
    /* allocate space, pack our hash, and send it */
    buf_send = (char*) KVTREE_MALLOC((size_t)size_send);
    kvtree_pack(buf_send, hash_send);
    MPI_Isend(buf_send, size_send, MPI_BYTE, rank_send, 0, comm, &request[num_req]);
    num_req++;
  }
  if (num_req > 0) {
    MPI_Waitall(num_req, request, status);
  }

  /* unpack the hash into the hash_recv provided by the caller */
  if (size_recv > 0) {
    kvtree_unpack(buf_recv, hash_recv);
  }

  /* free the pack buffers */
  kvtree_free(&buf_recv);
  kvtree_free(&buf_send);

  return rc;
}